

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFOBSFireFightingFactored.cpp
# Opt level: O2

Scope * __thiscall
ProblemFOBSFireFightingFactored::GetHousesAgentInfluences
          (Scope *__return_storage_ptr__,ProblemFOBSFireFightingFactored *this,Index agI)

{
  Index hI;
  ulong uVar1;
  
  (__return_storage_ptr__->super_SDT).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_SDT).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_SDT).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  for (uVar1 = 0;
      uVar1 < *(ulong *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
                         field_0x710; uVar1 = (ulong)((Index)uVar1 + 1)) {
    Scope::Insert(__return_storage_ptr__,(Index)uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

Scope ProblemFOBSFireFightingFactored::GetHousesAgentInfluences(Index agI) const
{
    Scope allHouses;
    for(Index hI=0; hI < _m_nrHouses; hI++)
        allHouses.Insert(hI);
    return(allHouses);
}